

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarBmc(Abc_Ntk_t *pNtk,int nStart,int nFrames,int nSizeMax,int nNodeDelta,int nTimeOut,
                 int nBTLimit,int nBTLimitAll,int fRewrite,int fNewAlgo,int fOrDecomp,int nCofFanLit
                 ,int fVerbose,int *piFrames)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Man_t *pAig;
  abctime aVar5;
  int iVar6;
  Abc_Cex_t *pAVar7;
  Abc_Ntk_t *pAVar8;
  Aig_Man_t *pAVar9;
  long lVar10;
  int iFrame;
  abctime local_50;
  Vec_Int_t *vMap;
  int local_3c;
  int local_38;
  int local_34;
  
  vMap = (Vec_Int_t *)0x0;
  local_3c = nStart;
  local_38 = nNodeDelta;
  local_34 = nSizeMax;
  local_50 = Abc_Clock();
  if (nTimeOut == 0) {
    lVar10 = 0;
  }
  else {
    aVar4 = Abc_Clock();
    lVar10 = aVar4 + (long)nTimeOut * 1000000;
  }
  if (fOrDecomp == 0) {
    pAVar8 = pNtk;
    pAig = Abc_NtkToDar(pNtk,0,1);
    iVar2 = (int)pAVar8;
  }
  else {
    pAVar8 = pNtk;
    pAig = Abc_NtkToDarBmc(pNtk,&vMap);
    iVar2 = (int)pAVar8;
  }
  if (pAig != (Aig_Man_t *)0x0) {
    if (pAig->nRegs < 1) {
      __assert_fail("pMan->nRegs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0x8e6,
                    "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *)"
                   );
    }
    if (vMap != (Vec_Int_t *)0x0) {
      if (vMap->nSize != pAig->nTruePos) {
        __assert_fail("vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0x8e7,
                      "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *)"
                     );
      }
      if ((fVerbose != 0) && (pNtk->vPos->nSize != vMap->nSize)) {
        Abc_Print(iVar2,"Expanded %d outputs into %d outputs using OR decomposition.\n");
      }
    }
    if (fNewAlgo == 0) {
      iVar2 = Saig_BmcPerform(pAig,local_3c,nFrames,local_38,nTimeOut,nBTLimit,nBTLimitAll,fVerbose,
                              0,piFrames,0);
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      free(pNtk->pSeqModel);
      pAVar7 = pAig->pSeqModel;
      pNtk->pSeqModel = pAVar7;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
    }
    else {
      iVar2 = Saig_ManBmcSimple(pAig,nFrames,local_34,nBTLimit,fRewrite,fVerbose,&iFrame,nCofFanLit)
      ;
      if (piFrames != (int *)0x0) {
        *piFrames = iFrame;
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      pAVar7 = pNtk->pSeqModel;
      free(pAVar7);
      pAVar1 = pAig->pSeqModel;
      pNtk->pSeqModel = pAVar1;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      iVar3 = (int)pAVar7;
      if (iVar2 == -1) {
        iVar6 = -1;
        if (-1 < iFrame) {
          iVar6 = iFrame;
        }
        Abc_Print(iVar3,"No output asserted in %d frames. Resource limit reached ",
                  (ulong)(iVar6 + 1));
        if ((lVar10 == 0) || (aVar4 = Abc_Clock(), aVar4 <= lVar10)) {
          Abc_Print(iVar3,"(conf limit %d). ",(ulong)(uint)nBTLimit);
        }
        else {
          Abc_Print(iVar3,"(timeout %d sec). ",lVar10);
        }
      }
      else if (iVar2 == 1) {
        Abc_Print(iVar3,"Incorrect return value.  ");
      }
      else {
        Abc_Print(iVar3,"Output %d of miter \"%s\" was asserted in frame %d. ",
                  (ulong)(uint)pAVar1->iPo,pNtk->pName,(ulong)(uint)pAVar1->iFrame);
      }
      aVar4 = local_50;
      Abc_Print(iVar3,"%s =","Time");
      aVar5 = Abc_Clock();
      Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
      pAVar7 = pNtk->pSeqModel;
    }
    if ((pAVar7 != (Abc_Cex_t *)0x0) &&
       (pAVar9 = pAig, iVar3 = Saig_ManVerifyCex(pAig,pAVar7), iVar3 == 0)) {
      Abc_Print((int)pAVar9,"Abc_NtkDarBmc(): Counter-example verification has FAILED.\n");
    }
    Aig_ManStop(pAig);
    if (vMap != (Vec_Int_t *)0x0 && pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      iVar3 = Vec_IntEntry(vMap,pNtk->pSeqModel->iPo);
      pNtk->pSeqModel->iPo = iVar3;
    }
    Vec_IntFreeP(&vMap);
    return iVar2;
  }
  Abc_Print(iVar2,"Converting miter into AIG has failed.\n");
  return -1;
}

Assistant:

int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames )
{
    Aig_Man_t * pMan;
    Vec_Int_t * vMap = NULL;
    int status, RetValue = -1;
    abctime clk = Abc_Clock();
    abctime nTimeLimit = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // derive the AIG manager
    if ( fOrDecomp )
        pMan = Abc_NtkToDarBmc( pNtk, &vMap );
    else
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return RetValue;
    }
    assert( pMan->nRegs > 0 );
    assert( vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan) );
    if ( fVerbose && vMap && Abc_NtkPoNum(pNtk) != Saig_ManPoNum(pMan) ) 
        Abc_Print( 1, "Expanded %d outputs into %d outputs using OR decomposition.\n", Abc_NtkPoNum(pNtk), Saig_ManPoNum(pMan) );

    // perform verification
    if ( fNewAlgo ) // command 'bmc'
    {
        int iFrame;
        RetValue = Saig_ManBmcSimple( pMan, nFrames, nSizeMax, nBTLimit, fRewrite, fVerbose, &iFrame, nCofFanLit );
        if ( piFrames )
            *piFrames = iFrame;
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( RetValue == 1 )
            Abc_Print( 1, "Incorrect return value.  " );
        else if ( RetValue == -1 )
        {
            Abc_Print( 1, "No output asserted in %d frames. Resource limit reached ", Abc_MaxInt(iFrame+1,0) );
            if ( nTimeLimit && Abc_Clock() > nTimeLimit )
                Abc_Print( 1, "(timeout %d sec). ", nTimeLimit );
            else
                Abc_Print( 1, "(conf limit %d). ", nBTLimit );
        }
        else // if ( RetValue == 0 )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", pCex->iPo, pNtk->pName, pCex->iFrame );
        }
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
    { 
        RetValue = Saig_BmcPerform( pMan, nStart, nFrames, nNodeDelta, nTimeOut, nBTLimit, nBTLimitAll, fVerbose, 0, piFrames, 0 );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    // verify counter-example
    if ( pNtk->pSeqModel ) 
    {
        status = Saig_ManVerifyCex( pMan, pNtk->pSeqModel );
        if ( status == 0 )
            Abc_Print( 1, "Abc_NtkDarBmc(): Counter-example verification has FAILED.\n" );
    }
    Aig_ManStop( pMan );
    // update the counter-example
    if ( pNtk->pSeqModel && vMap )
        pNtk->pSeqModel->iPo = Vec_IntEntry( vMap, pNtk->pSeqModel->iPo );
    Vec_IntFreeP( &vMap );
    return RetValue;
}